

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void helper_sysexit_x86_64(CPUX86State *env,int dflag)

{
  uint32_t uVar1;
  uint uVar2;
  uint new_hflags;
  uint uVar3;
  uintptr_t unaff_retaddr;
  
  uVar1 = env->sysenter_cs;
  if ((uVar1 != 0) && (uVar2 = env->hflags, (uVar2 & 3) == 0)) {
    if (dflag == 2) {
      env->segs[1].selector = uVar1 + 0x20 & 0xffff | 3;
      env->segs[1].base = 0;
      env->segs[1].limit = 0xffffffff;
      env->segs[1].flags = 0xe0fb00;
      if ((uVar2 >> 0xe & 1) == 0) {
        uVar2 = uVar2 & 0xffff3fec | env->segs[1].flags >> 0x12 & 0x10;
      }
      else {
        uVar2 = uVar2 & 0xffff7f8c | 0x8030;
      }
      env->hflags = uVar2;
      uVar3 = env->segs[2].flags >> 0x11 & 0x20;
      if (-1 < (short)uVar2) {
        if ((((env->cr[0] & 1) == 0) || ((uVar2 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0)) {
          uVar3 = uVar3 | 0x40;
        }
        else {
          uVar3 = uVar3 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                env->segs[2].base != 0) << 6;
        }
      }
      uVar3 = uVar2 & 0xffffff9c | uVar3;
      uVar2 = uVar1 + 0x28;
    }
    else {
      env->segs[1].selector = uVar1 + 0x10 & 0xffff | 3;
      env->segs[1].base = 0;
      env->segs[1].limit = 0xffffffff;
      env->segs[1].flags = 0xc0fb00;
      env->hflags = uVar2 & 0xffff7fec | 0x10;
      uVar3 = env->segs[2].flags >> 0x11 & 0x20;
      if (((env->cr[0] & 1) == 0) || ((env->eflags & 0x20000) != 0)) {
        uVar3 = uVar3 | 0x40;
      }
      else {
        uVar3 = uVar3 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                              env->segs[2].base != 0) << 6;
      }
      uVar3 = uVar2 & 0xffff7f8c | 0x10 | uVar3;
      uVar2 = uVar1 + 0x18;
    }
    env->segs[2].selector = uVar2 & 0xffff | 3;
    env->segs[2].base = 0;
    env->segs[2].limit = 0xffffffff;
    env->segs[2].flags = 0xc0f300;
    env->hflags = uVar3 | 3;
    cpu_sync_bndcs_hflags_x86_64(env);
    uVar2 = env->hflags;
    uVar3 = env->segs[2].flags >> 0x11 & 0x20;
    if (-1 < (short)uVar2) {
      if ((((env->cr[0] & 1) == 0) || ((uVar2 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0)) {
        uVar3 = uVar3 | 0x40;
      }
      else {
        uVar3 = uVar3 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                              env->segs[2].base != 0) << 6;
      }
    }
    env->hflags = uVar2 & 0xffffff9f | uVar3;
    env->regs[4] = env->regs[1];
    env->eip = env->regs[2];
    return;
  }
  raise_exception_err_ra_x86_64(env,0xd,0,unaff_retaddr);
}

Assistant:

void helper_sysexit(CPUX86State *env, int dflag)
{
    int cpl;

    cpl = env->hflags & HF_CPL_MASK;
    if (env->sysenter_cs == 0 || cpl != 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }
#ifdef TARGET_X86_64
    if (dflag == 2) {
        cpu_x86_load_seg_cache(env, R_CS, ((env->sysenter_cs + 32) & 0xfffc) |
                               3, 0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK |
                               DESC_L_MASK);
        cpu_x86_load_seg_cache(env, R_SS, ((env->sysenter_cs + 40) & 0xfffc) |
                               3, 0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_W_MASK | DESC_A_MASK);
    } else
#endif
    {
        cpu_x86_load_seg_cache(env, R_CS, ((env->sysenter_cs + 16) & 0xfffc) |
                               3, 0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK);
        cpu_x86_load_seg_cache(env, R_SS, ((env->sysenter_cs + 24) & 0xfffc) |
                               3, 0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_W_MASK | DESC_A_MASK);
    }
    env->regs[R_ESP] = env->regs[R_ECX];
    env->eip = env->regs[R_EDX];
}